

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void erase_lots(Terminal *term,_Bool line_only,_Bool from_begin,_Bool to_end)

{
  _Bool _Var1;
  wchar_t wVar2;
  termline *local_40;
  termline *ldata;
  wchar_t wStack_30;
  wchar_t scrolllines;
  pos boundary;
  _Bool erasing_lines_from_top;
  wchar_t wStack_20;
  _Bool erase_lattr;
  pos end;
  pos start;
  _Bool to_end_local;
  _Bool from_begin_local;
  _Bool line_only_local;
  Terminal *term_local;
  
  boundary.y._2_1_ = 0;
  boundary.y._3_1_ = !line_only;
  if ((bool)boundary.y._3_1_) {
    end.y = L'\0';
    end.x = L'\0';
    boundary.x = term->rows;
  }
  else {
    end.x = L'\0';
    end.y = (term->curs).y;
    boundary.x = (term->curs).y + L'\x01';
  }
  wStack_20 = L'\0';
  _wStack_30 = term->curs;
  if (!from_begin) {
    if ((term->wrapnext & 1U) != 0) {
      incpos_fn((pos *)&stack0xffffffffffffffd0,term->cols);
    }
    end = _wStack_30;
  }
  if (!to_end) {
    incpos_fn((pos *)&stack0xffffffffffffffd0,term->cols);
    stack0xffffffffffffffdc = _wStack_30;
  }
  if ((!from_begin) || (!to_end)) {
    check_boundary(term,scrolllines,wStack_30);
  }
  check_selection(term,end,stack0xffffffffffffffdc);
  if (((end.y == L'\0') && (end.x == L'\0')) && (boundary.x == term->rows)) {
    term_invalidate(term);
  }
  if (((end.y == L'\0') && (end.x == L'\0')) &&
     ((wStack_20 == L'\0' && ((boundary.y._3_1_ & 1) != 0)))) {
    boundary.y._2_1_ = 1;
  }
  if (((term->erase_to_scrollback & 1U) == 0) || ((boundary.y._2_1_ & 1) == 0)) {
    local_40 = lineptr(term,end.y,L'ହ',L'\x01');
    check_trust_status(term,local_40);
    while (_Var1 = poslt(end,stack0xffffffffffffffdc), _Var1) {
      check_line_size(term,local_40);
      if (end.x == term->cols) {
        if ((boundary.y._3_1_ & 1) == 0) {
          local_40->lattr = local_40->lattr & 0xffcf;
        }
        else {
          local_40->lattr = 0;
        }
      }
      else {
        copy_termchar(local_40,end.x,&term->erase_char);
      }
      _Var1 = incpos_fn(&end,term->cols);
      if ((_Var1) && (end.y < term->rows)) {
        local_40 = lineptr(term,end.y,L'୆',L'\x01');
        check_trust_status(term,local_40);
      }
    }
  }
  else {
    ldata._4_4_ = boundary.x;
    if (boundary.x == term->rows) {
      wVar2 = find_last_nonempty_line(term,term->screen);
      ldata._4_4_ = wVar2 + L'\x01';
    }
    if (L'\0' < ldata._4_4_) {
      scroll(term,L'\0',ldata._4_4_ + L'\xffffffff',ldata._4_4_,true);
    }
  }
  if (((boundary.y._2_1_ & 1) != 0) && (term->alt_which == L'\0')) {
    term->tempsblines = L'\0';
  }
  return;
}

Assistant:

static void erase_lots(Terminal *term,
                       bool line_only, bool from_begin, bool to_end)
{
    pos start, end;
    bool erase_lattr;
    bool erasing_lines_from_top = false;

    if (line_only) {
        start.y = term->curs.y;
        start.x = 0;
        end.y = term->curs.y + 1;
        end.x = 0;
        erase_lattr = false;
    } else {
        start.y = 0;
        start.x = 0;
        end.y = term->rows;
        end.x = 0;
        erase_lattr = true;
    }

    /* This is the endpoint of the clearing operation that is not
     * either the start or end of the line / screen. */
    pos boundary = term->curs;

    if (!from_begin) {
        /*
         * If we're erasing from the current char to the end of
         * line/screen, then we take account of wrapnext, so as to
         * maintain the invariant that writing a printing character
         * followed by ESC[K should not overwrite the character you
         * _just wrote_. That is, when wrapnext says the cursor is
         * 'logically' at the very rightmost edge of the screen
         * instead of just before the last printing char, ESC[K should
         * do nothing at all, and ESC[J should clear the next line but
         * leave this one unchanged.
         *
         * This adjusted position will also be the position we use for
         * check_boundary (i.e. the thing we ensure isn't in the
         * middle of a double-width printing char).
         */
        if (term->wrapnext)
            incpos(boundary);

        start = boundary;
    }
    if (!to_end) {
        /*
         * If we're erasing from the start of (at least) the line _to_
         * the current position, then that is taken to mean 'inclusive
         * of the cell under the cursor', which means we don't
         * consider wrapnext at all: whether it's set or not, we still
         * clear the cell under the cursor.
         *
         * Again, that incremented boundary position is where we
         * should be careful of a straddling wide character.
         */
        incpos(boundary);
        end = boundary;
    }
    if (!from_begin || !to_end)
        check_boundary(term, boundary.x, boundary.y);
    check_selection(term, start, end);

    /* Clear screen also forces a full window redraw, just in case. */
    if (start.y == 0 && start.x == 0 && end.y == term->rows)
        term_invalidate(term);

    /* Lines scrolled away shouldn't be brought back on if the terminal
     * resizes. */
    if (start.y == 0 && start.x == 0 && end.x == 0 && erase_lattr)
        erasing_lines_from_top = true;

    if (term->erase_to_scrollback && erasing_lines_from_top) {
        /* If it's a whole number of lines, starting at the top, and
         * we're fully erasing them, erase by scrolling and keep the
         * lines in the scrollback. */
        int scrolllines = end.y;
        if (end.y == term->rows) {
            /* Shrink until we find a non-empty row.*/
            scrolllines = find_last_nonempty_line(term, term->screen) + 1;
        }
        if (scrolllines > 0)
            scroll(term, 0, scrolllines - 1, scrolllines, true);
    } else {
        termline *ldata = scrlineptr(start.y);
        check_trust_status(term, ldata);
        while (poslt(start, end)) {
            check_line_size(term, ldata);
            if (start.x == term->cols) {
                if (!erase_lattr)
                    ldata->lattr &= ~(LATTR_WRAPPED | LATTR_WRAPPED2);
                else
                    ldata->lattr = LATTR_NORM;
            } else {
                copy_termchar(ldata, start.x, &term->erase_char);
            }
            if (incpos(start) && start.y < term->rows) {
                ldata = scrlineptr(start.y);
                check_trust_status(term, ldata);
            }
        }
    }

    /* After an erase of lines from the top of the screen, we shouldn't
     * bring the lines back again if the terminal enlarges (since the user or
     * application has explicitly thrown them away). */
    if (erasing_lines_from_top && !(term->alt_which))
        term->tempsblines = 0;
}